

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3BitvecClear(Bitvec *p,u32 i,void *pBuf)

{
  anon_union_496_3_7c964c52_for_u *__src;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  u32 uVar4;
  long lVar5;
  uint uVar6;
  u32 *aiValues;
  
  if (p != (Bitvec *)0x0) {
    uVar6 = i - 1;
    do {
      uVar3 = p->iDivisor;
      if (uVar3 == 0) {
        if (p->iSize < 0xf81) {
          (p->u).aBitmap[uVar6 >> 3] = (p->u).aBitmap[uVar6 >> 3] & ~(byte)(1 << ((byte)uVar6 & 7));
          return;
        }
        __src = &p->u;
        memcpy(pBuf,__src,0x1f0);
        memset(__src,0,0x1f0);
        p->nSet = 0;
        uVar4 = 0;
        for (lVar5 = 0; lVar5 != 0x7c; lVar5 = lVar5 + 1) {
          iVar1 = *(int *)((long)pBuf + lVar5 * 4);
          if ((iVar1 != 0) && (iVar1 != uVar6 + 1)) {
            uVar4 = uVar4 + 1;
            p->nSet = uVar4;
            uVar2 = (ulong)(iVar1 - 1) % 0x7c;
            while (__src->aHash[uVar2] != 0) {
              uVar3 = (int)uVar2 + 1;
              uVar2 = (ulong)uVar3;
              if (0x7b < uVar3) {
                uVar2 = 0;
              }
            }
            __src->aHash[uVar2] = *(u32 *)((long)pBuf + lVar5 * 4);
          }
        }
        return;
      }
      uVar2 = (ulong)uVar6;
      uVar6 = uVar6 % uVar3;
      p = *(Bitvec **)((long)&p->u + (uVar2 / uVar3) * 8);
    } while (p != (Bitvec *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BitvecClear(Bitvec *p, u32 i, void *pBuf){
  if( p==0 ) return;
  assert( i>0 );
  i--;
  while( p->iDivisor ){
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    p = p->u.apSub[bin];
    if (!p) {
      return;
    }
  }
  if( p->iSize<=BITVEC_NBIT ){
    p->u.aBitmap[i/BITVEC_SZELEM] &= ~(1 << (i&(BITVEC_SZELEM-1)));
  }else{
    unsigned int j;
    u32 *aiValues = pBuf;
    memcpy(aiValues, p->u.aHash, sizeof(p->u.aHash));
    memset(p->u.aHash, 0, sizeof(p->u.aHash));
    p->nSet = 0;
    for(j=0; j<BITVEC_NINT; j++){
      if( aiValues[j] && aiValues[j]!=(i+1) ){
        u32 h = BITVEC_HASH(aiValues[j]-1);
        p->nSet++;
        while( p->u.aHash[h] ){
          h++;
          if( h>=BITVEC_NINT ) h = 0;
        }
        p->u.aHash[h] = aiValues[j];
      }
    }
  }
}